

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.h
# Opt level: O2

Node __thiscall trieste::Parse::parse_file(Parse *this,path *filename)

{
  bool bVar1;
  path *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Node NVar3;
  Source source;
  undefined1 auStack_98 [32];
  undefined1 local_78 [8];
  string local_70;
  path local_50;
  
  if (filename[1]._M_cmpts._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl !=
      (_Impl *)0x0) {
    bVar1 = CLI::std::
            function<bool_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&)>::
            operator()((function<bool_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&)>
                        *)&filename[1]._M_pathname.field_2,(Parse *)filename,in_RDX);
    if (!bVar1) {
      *(undefined8 *)this = 0;
      this->wf_ = (Wellformed *)0x0;
      _Var2._M_pi = extraout_RDX;
      goto LAB_0015c080;
    }
  }
  SourceDef::load((SourceDef *)auStack_98,in_RDX);
  CLI::std::filesystem::__cxx11::path::stem(&local_50,in_RDX);
  CLI::std::filesystem::__cxx11::path::string((string *)(local_78 + 8),&local_50);
  local_78 = (undefined1  [8])File;
  parse_source(this,&filename->_M_pathname,(Token *)(local_78 + 8),(Source *)local_78);
  std::__cxx11::string::~string((string *)(local_78 + 8));
  CLI::std::filesystem::__cxx11::path::~path(&local_50);
  if ((filename[3]._M_pathname.field_2._M_allocated_capacity != 0) && (*(long *)this != 0)) {
    std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)(auStack_98 + 0x10),
               (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)this);
    CLI::std::
    function<void_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&,_std::shared_ptr<trieste::NodeDef>)>
    ::operator()((function<void_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&,_std::shared_ptr<trieste::NodeDef>)>
                  *)(filename + 3),(Parse *)filename,in_RDX,
                 (shared_ptr<trieste::NodeDef> *)(auStack_98 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_98 + 0x18));
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_98 + 8));
  _Var2._M_pi = extraout_RDX_00;
LAB_0015c080:
  NVar3.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  NVar3.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Node)NVar3.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node parse_file(const std::filesystem::path& filename) const
    {
      if (prefile_ && !prefile_(*this, filename))
        return {};

      auto source = SourceDef::load(filename);
      auto ast = parse_source(filename.stem().string(), File, source);

      if (postfile_ && ast)
        postfile_(*this, filename, ast);

      return ast;
    }